

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

int __thiscall
asio::basic_socket_acceptor<asio::ip::tcp>::close
          (basic_socket_acceptor<asio::ip::tcp> *this,int __fd)

{
  int extraout_EAX;
  service_type *psVar1;
  implementation_type *piVar2;
  error_code ec;
  error_code *in_stack_ffffffffffffffd0;
  error_code *err;
  
  std::error_code::error_code(in_stack_ffffffffffffffd0);
  psVar1 = basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>::get_service
                     (&this->
                       super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                     );
  err = (error_code *)&psVar1->super_reactive_socket_service_base;
  piVar2 = basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>::
           get_implementation(&this->
                               super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                             );
  detail::reactive_socket_service_base::close((reactive_socket_service_base *)err,(int)piVar2);
  detail::throw_error(err,(char *)this);
  return extraout_EAX;
}

Assistant:

void close()
  {
    asio::error_code ec;
    this->get_service().close(this->get_implementation(), ec);
    asio::detail::throw_error(ec, "close");
  }